

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O2

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p)

{
  int iVar1;
  
  iVar1 = 1;
  for (; T != (BiTree)0x0; T = (&T->lchild)[T->data <= key]) {
    if (T->data == key) goto LAB_00101383;
    m = T;
  }
  iVar1 = 0;
  T = m;
LAB_00101383:
  *p = T;
  return iVar1;
}

Assistant:

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p){
    if(!T){             //查找失败
        *p = m;
        return 0;
    }
    else if (key == T->data){   //找到key
        *p = T;
        return 1;
    }
    else if(key < T->data){
        return SearchBBT(T->lchild,key,T,p);
    }
    else {
        return SearchBBT(T->rchlid,key,T,p);
    }
}